

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O1

reentrant_put_transaction<void> *
density_tests::detail::
TryPutFloat<density::sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *queue,EasyRandom *i_rand)

{
  progress_guarantee i_progress_guarantee;
  result_type_conflict rVar1;
  reentrant_put_transaction<float> *__return_storage_ptr___00;
  float source;
  float local_6c;
  reentrant_put_transaction<float> local_68;
  reentrant_put_transaction<float> local_48;
  
  local_6c = 3.1415;
  local_68.m_put.m_control_block = (LfQueueControl *)0x300000000;
  i_progress_guarantee =
       std::uniform_int_distribution<int>::operator()
                 ((uniform_int_distribution<int> *)&local_68,&i_rand->m_rand,(param_type *)&local_68
                 );
  if (progress_wait_free < i_progress_guarantee) {
    assert_failed<>("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                    ,0xce);
    i_progress_guarantee = progress_blocking;
  }
  local_68.m_put.m_control_block = (LfQueueControl *)0x300000000;
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_68,&i_rand->m_rand,
                     (param_type *)&local_68);
  switch(rVar1) {
  case 1:
    __return_storage_ptr___00 = &local_68;
    density::
    sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
    ::try_start_reentrant_emplace<float,float&>
              (__return_storage_ptr___00,
               (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
                *)queue,i_progress_guarantee,&local_6c);
    (__return_storage_ptr__->m_put).m_user_storage = local_68.m_put.m_user_storage;
    (__return_storage_ptr__->m_put).m_control_block = local_68.m_put.m_control_block;
    (__return_storage_ptr__->m_put).m_next_ptr = local_68.m_put.m_next_ptr;
    __return_storage_ptr__->m_queue = local_68.m_queue;
    local_68.m_put.m_user_storage = (void *)0x0;
    break;
  case 2:
    local_48.m_put.m_control_block =
         (LfQueueControl *)
         density::detail::
         FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,float>
         ::s_table;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::try_start_reentrant_dyn_push_copy
              ((reentrant_put_transaction<void> *)&local_68,
               (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                *)queue,i_progress_guarantee,(runtime_type *)&local_48,&local_6c);
    goto LAB_00dfd8a7;
  case 3:
    local_48.m_put.m_control_block =
         (LfQueueControl *)
         density::detail::
         FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,float>
         ::s_table;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::try_start_reentrant_dyn_push_move
              ((reentrant_put_transaction<void> *)&local_68,
               (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                *)queue,i_progress_guarantee,(runtime_type *)&local_48,&local_6c);
LAB_00dfd8a7:
    (__return_storage_ptr__->m_put).m_user_storage = local_68.m_put.m_user_storage;
    (__return_storage_ptr__->m_put).m_control_block = local_68.m_put.m_control_block;
    (__return_storage_ptr__->m_put).m_next_ptr = local_68.m_put.m_next_ptr;
    __return_storage_ptr__->m_queue = local_68.m_queue;
    local_68.m_put.m_user_storage = (void *)0x0;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<void>::~reentrant_put_transaction
              ((reentrant_put_transaction<void> *)&local_68);
    return __return_storage_ptr__;
  default:
    assert_failed<>("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                    ,0x109);
  case 0:
    density::
    sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
    ::try_start_reentrant_emplace<float,float&>
              (&local_68,
               (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
                *)queue,i_progress_guarantee,&local_6c);
    __return_storage_ptr___00 = &local_48;
    local_48.m_put.m_control_block = local_68.m_put.m_control_block;
    local_48.m_put.m_next_ptr = local_68.m_put.m_next_ptr;
    local_48.m_put.m_user_storage = local_68.m_put.m_user_storage;
    local_48.m_queue = local_68.m_queue;
    local_68.m_put.m_user_storage = (void *)0x0;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<float>::~reentrant_put_transaction(&local_68);
    (__return_storage_ptr__->m_put).m_user_storage = local_48.m_put.m_user_storage;
    (__return_storage_ptr__->m_put).m_control_block = local_48.m_put.m_control_block;
    (__return_storage_ptr__->m_put).m_next_ptr = local_48.m_put.m_next_ptr;
    __return_storage_ptr__->m_queue = local_48.m_queue;
    local_48.m_put.m_user_storage = (void *)0x0;
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<float>::~reentrant_put_transaction(__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & queue, EasyRandom & i_rand)
            {
                auto       source             = s_value;
                auto const progress_guarantee = get_rand_progress_guarantee(i_rand);
                switch (i_rand.get_int(3))
                {
                default:
                    DENSITY_TEST_ASSERT(false);
                case 0:
                    return queue.try_start_reentrant_push(progress_guarantee, source);
                case 1:
                    return queue.template try_start_reentrant_emplace<float>(
                      progress_guarantee, source);
                case 2:
                    return queue.try_start_reentrant_dyn_push_copy(
                      progress_guarantee, QUEUE::runtime_type::template make<float>(), &source);
                case 3:
                    return queue.try_start_reentrant_dyn_push_move(
                      progress_guarantee, QUEUE::runtime_type::template make<float>(), &source);

                    /*case 2:
                {
                    auto put = queue.template try_start_reentrant_dyn_push(progress_guarantee,
                        QUEUE::runtime_type::template make<float>());
                    if (put)
                    {
                        *static_cast<float*>(put.element_ptr()) += source;
                    }
                    return static_cast<bool>(put);
                }*/
                }
            }